

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       format_decimal<char,unsigned_long,char*,fmt::v5::internal::no_thousands_sep>
                 (void *out,undefined8 param_2,int num_digits)

{
  char *pcVar1;
  size_t __n;
  char_type buffer [26];
  undefined1 auStack_38 [32];
  
  if (-1 < num_digits) {
    pcVar1 = format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>(auStack_38);
    __n = (long)pcVar1 - (long)auStack_38;
    if (__n != 0) {
      memcpy(out,auStack_38,__n);
    }
    return (char *)((long)out + __n);
  }
  __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                ,0x3dd,
                "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = char, UInt = unsigned long, Iterator = char *, ThousandsSep = fmt::internal::no_thousands_sep]"
               );
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}